

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O3

void __thiscall antlr::ASTFactory::makeASTRoot(ASTFactory *this,ASTPair *currentAST,RefAST *root)

{
  AST *pAVar1;
  ASTRefCount<antlr::AST> local_18;
  
  if ((root->ref != (ASTRef *)0x0) && (pAVar1 = root->ref->ptr, pAVar1 != (AST *)0x0)) {
    local_18.ref = (currentAST->root).ref;
    if (local_18.ref != (ASTRef *)0x0) {
      (local_18.ref)->count = (local_18.ref)->count + 1;
    }
    (*pAVar1->_vptr_AST[0xb])();
    ASTRefCount<antlr::AST>::~ASTRefCount(&local_18);
    ASTRefCount<antlr::AST>::operator=(&currentAST->child,&currentAST->root);
    ASTPair::advanceChildToEnd(currentAST);
    ASTRefCount<antlr::AST>::operator=(&currentAST->root,root);
  }
  return;
}

Assistant:

void ASTFactory::setMaxNodeType( int type )
{
	if( nodeFactories.size() < (static_cast<unsigned int>(type)+1) )
		nodeFactories.resize( type+1, &default_factory_descriptor );
}